

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void hermite_ss_compute(int order,double *xtab,double *weight)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double local_70;
  double dp2;
  double p1;
  double local_58;
  uint local_4c;
  double local_48;
  double local_40;
  double local_38;
  
  local_58 = (double)order;
  local_48 = tgamma(local_58);
  local_40 = ldexp(1.0,order - 1U);
  dVar4 = pow(local_58 + local_58 + 1.0,0.16666666666666666);
  if (0 < order) {
    local_48 = (local_48 * 1.7724538509055159) / local_40;
    local_40 = (double)(ulong)(order + 1U >> 1);
    p1 = dVar4 * dVar4 * dVar4 + -1.85575 / dVar4;
    uVar3 = (ulong)(uint)order;
    uVar2 = 0;
    dVar4 = -1.85575 / dVar4;
    local_4c = order - 1U;
    do {
      uVar3 = uVar3 - 1;
      switch(uVar2 & 0xffffffff) {
      case 0:
        local_38 = p1;
        break;
      case 1:
        dVar5 = pow(local_58,0.426);
        local_38 = (dVar5 * -1.14) / dVar4 + dVar4;
        break;
      case 2:
        local_38 = *xtab * -0.86;
        dVar4 = dVar4 * 1.86;
        goto LAB_001e6d1c;
      case 3:
        local_38 = xtab[1] * -0.91;
        dVar4 = dVar4 * 1.91;
LAB_001e6d1c:
        local_38 = dVar4 + local_38;
        break;
      default:
        local_38 = (dVar4 + dVar4) - xtab[uVar2 - 2];
      }
      hermite_ss_root(&local_38,order,&local_70,&dp2);
      xtab[uVar2] = local_38;
      weight[uVar2] = (local_48 / local_70) / dp2;
      xtab[uVar3] = -local_38;
      weight[uVar3] = weight[uVar2];
      uVar2 = uVar2 + 1;
      dVar4 = local_38;
    } while (local_40 != (double)uVar2);
    if (order != 1) {
      pdVar1 = xtab + local_4c;
      uVar2 = 0;
      do {
        dVar4 = xtab[uVar2];
        xtab[uVar2] = *pdVar1;
        *pdVar1 = dVar4;
        uVar2 = uVar2 + 1;
        pdVar1 = pdVar1 + -1;
      } while ((uint)order >> 1 != uVar2);
    }
  }
  return;
}

Assistant:

void hermite_ss_compute ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_SS_COMPUTE computes a Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The abscissas are the zeros of the N-th order Hermite polynomial.
//
//    The integral:
//
//      Integral ( -oo < X < +oo ) exp ( - X*X ) * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the formula to be computed.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double cc;
  double dp2;
  int i;
  double p1;
  const double r8_pi = 3.141592653589793;
  double s;
  double x;

  cc = sqrt ( r8_pi ) * tgamma ( double( order ) ) 
    / pow ( 2.0, order - 1 );

  s = pow ( 2.0 * double( order ) + 1.0, 1.0 / 6.0 );

  for ( i = 0; i < ( order + 1 ) / 2; i++ )
  {
    if ( i == 0 )
    {
      x = s * s * s - 1.85575 / s;
    }
    else if ( i == 1 )
    {
      x = x - 1.14 * pow ( double( order ), 0.426 ) / x;
    }
    else if ( i == 2 )
    {
      x = 1.86 * x - 0.86 * xtab[0];
    }
    else if ( i == 3 )
    {
      x = 1.91 * x - 0.91 * xtab[1];
    }
    else
    {
      x = 2.0 * x - xtab[i-2];
    }

    hermite_ss_root ( &x, order, &dp2, &p1 );

    xtab[i] = x;
    weight[i] = ( cc / dp2 ) / p1;

    xtab[order-i-1] = -x;
    weight[order-i-1] = weight[i];
  }
//
//  Reverse the order of the values.
//
  for ( i = 0; i < ( order / 2 ); i++ )
  {
    x               = xtab[i];
    xtab[i]         = xtab[order-1-i];
    xtab[order-1-i] = x;
  }

  return;
}